

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.h
# Opt level: O1

void __thiscall CMDPSTATE::~CMDPSTATE(CMDPSTATE *this)

{
  pointer piVar1;
  pointer ppCVar2;
  runtime_error *this_00;
  
  if (this->PlannerSpecificData != (void *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: state deletion: planner specific data is not deleted");
    *(undefined ***)this_00 = &PTR__runtime_error_001574d0;
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar1 = (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->PredsID).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppCVar2 = (this->Actions).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->Actions).
                                  super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2)
    ;
    return;
  }
  return;
}

Assistant:

~CMDPSTATE()
    {
        if (PlannerSpecificData != NULL) {
            const char* msg = "ERROR: state deletion: planner specific data is not deleted";
            SBPL_FPRINTF(stderr, "%s\n", msg);
            throw SBPL_Exception(msg);
        }
    }